

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  size_t sVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  secp256k1_selftest();
  sVar1 = secp256k1_context_preallocated_size(flags);
  if (sVar1 == 0) {
    return (secp256k1_context *)0x0;
  }
  if (prealloc == (void *)0x0) {
    pcVar3 = "test condition failed: prealloc != NULL";
    uVar2 = 0x94;
  }
  else {
    *(secp256k1_callback *)((long)prealloc + 0xc0) = default_illegal_callback;
    *(secp256k1_callback *)((long)prealloc + 0xd0) = default_error_callback;
    if ((char)flags == '\x01') {
      secp256k1_ecmult_gen_blind((secp256k1_ecmult_gen_context *)prealloc,(uchar *)0x0);
      *(undefined4 *)prealloc = 1;
      *(uint *)((long)prealloc + 0xe0) = flags >> 10 & 1;
      return (secp256k1_context *)prealloc;
    }
    pcVar3 = 
    "test condition failed: (flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_CONTEXT";
    uVar2 = 0x9a;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/secp256k1.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    size_t prealloc_size;
    secp256k1_context* ret;

    secp256k1_selftest();

    prealloc_size = secp256k1_context_preallocated_size(flags);
    if (prealloc_size == 0) {
        return NULL;
    }
    VERIFY_CHECK(prealloc != NULL);
    ret = (secp256k1_context*)prealloc;
    ret->illegal_callback = default_illegal_callback;
    ret->error_callback = default_error_callback;

    /* Flags have been checked by secp256k1_context_preallocated_size. */
    VERIFY_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_CONTEXT);
    secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx);
    ret->declassify = !!(flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY);

    return ret;
}